

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::has_crlf(string *s)

{
  char *local_20;
  char *p;
  string *s_local;
  
  local_20 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (s);
  while( true ) {
    if (*local_20 == '\0') {
      return false;
    }
    if ((*local_20 == '\r') || (*local_20 == '\n')) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

inline bool has_crlf(const std::string &s) {
  auto p = s.c_str();
  while (*p) {
    if (*p == '\r' || *p == '\n') { return true; }
    p++;
  }
  return false;
}